

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDElementDecl.cpp
# Opt level: O0

void __thiscall xercesc_4_0::DTDElementDecl::addAttDef(DTDElementDecl *this,DTDAttDef *toAdd)

{
  RefHashTableOf<xercesc_4_0::DTDAttDef,_xercesc_4_0::StringHasher> *pRVar1;
  int iVar2;
  XMLSize_t newId;
  undefined4 extraout_var;
  MemoryManager *pMVar3;
  DTDAttDefList *this_00;
  DTDAttDef *toAdd_local;
  DTDElementDecl *this_local;
  
  if (this->fAttDefs == (RefHashTableOf<xercesc_4_0::DTDAttDef,_xercesc_4_0::StringHasher> *)0x0) {
    faultInAttDefList(this);
  }
  newId = XMLElementDecl::getId(&this->super_XMLElementDecl);
  DTDAttDef::setElemId(toAdd,newId);
  pRVar1 = this->fAttDefs;
  iVar2 = (*(toAdd->super_XMLAttDef).super_XSerializable._vptr_XSerializable[5])();
  RefHashTableOf<xercesc_4_0::DTDAttDef,_xercesc_4_0::StringHasher>::put
            (pRVar1,(void *)CONCAT44(extraout_var,iVar2),toAdd);
  if (this->fAttList == (DTDAttDefList *)0x0) {
    pMVar3 = XMLElementDecl::getMemoryManager(&this->super_XMLElementDecl);
    this_00 = (DTDAttDefList *)XMemory::operator_new(0x38,pMVar3);
    pRVar1 = this->fAttDefs;
    pMVar3 = XMLElementDecl::getMemoryManager(&this->super_XMLElementDecl);
    DTDAttDefList::DTDAttDefList(this_00,pRVar1,pMVar3);
    this->fAttList = this_00;
  }
  DTDAttDefList::addAttDef(this->fAttList,toAdd);
  return;
}

Assistant:

void DTDElementDecl::addAttDef(DTDAttDef* const toAdd)
{
    // Fault in the att list if required
    if (!fAttDefs)
            faultInAttDefList();

    // Tell this guy the element id of its parent (us)
    toAdd->setElemId(getId());

    fAttDefs->put((void*)(toAdd->getFullName()), toAdd);
    // update and/or create fAttList
    if(!fAttList)
        ((DTDElementDecl*)this)->fAttList = new (getMemoryManager()) DTDAttDefList(fAttDefs,getMemoryManager());
    fAttList->addAttDef(toAdd);
}